

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O0

loc_conflict monster_target_loc(monster *mon)

{
  _Bool _Var1;
  monster_conflict *pmVar2;
  loc grid2;
  monster *mon_local;
  
  if ((mon->target).midx == L'\xffffffff') {
    _Var1 = monster_is_decoyed(mon);
    if (_Var1) {
      mon_local = (monster *)cave_find_decoy(cave);
    }
    else {
      mon_local = *(monster **)&player->grid;
    }
  }
  else if ((mon->target).midx < L'\x01') {
    grid2 = loc(0,0);
    _Var1 = loc_eq((mon->target).grid,grid2);
    if (_Var1) {
      mon_local = *(monster **)&mon->grid;
    }
    else {
      mon_local = *(monster **)&(mon->target).grid;
    }
  }
  else {
    pmVar2 = cave_monster(cave,(mon->target).midx);
    mon_local = *(monster **)&pmVar2->grid;
  }
  return (loc_conflict)mon_local;
}

Assistant:

struct loc monster_target_loc(const struct monster *mon)
{
	if (mon->target.midx == -1) {
		/* Player (or decoy) */
		return monster_is_decoyed(mon) ? cave_find_decoy(cave) : player->grid;
	} else if (mon->target.midx > 0) {
		/* Monster */
		return cave_monster(cave, mon->target.midx)->grid;
	} else if (!loc_eq(mon->target.grid, loc(0, 0))) {
		return mon->target.grid;
	}
	/* Probably an error */
	return mon->grid;
}